

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O0

void __thiscall cs222::Pass2::readSymbols(Pass2 *this)

{
  mapped_type mVar1;
  byte bVar2;
  bool bVar3;
  runtime_error *this_00;
  streambuf *psVar4;
  void *pvVar5;
  mapped_type *pmVar6;
  long local_678;
  stringstream buf_1;
  ostream local_668 [380];
  mapped_type local_4ec;
  undefined1 local_4e8 [4];
  int address_1;
  string key_1;
  allocator local_4a1;
  string local_4a0;
  undefined1 local_480 [8];
  string litTabPath;
  stringstream buf;
  ostream local_450 [380];
  mapped_type local_2d4;
  undefined1 local_2d0 [4];
  int address;
  string key;
  allocator local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long local_238;
  ifstream ifs;
  undefined1 local_30 [8];
  string symTabPath;
  Pass2 *this_local;
  
  symTabPath.field_2._8_8_ = this;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 &this->srcFileName,".symtab");
  std::ifstream::ifstream(&local_238,(string *)local_30,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar2 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_288,"Cannot open file: ",&local_289);
    std::operator+(&local_268,&local_288,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
    std::runtime_error::runtime_error(this_00,(string *)&local_268);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&key.field_2 + 8),"Reading SYMTAB from ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  logDebug((string *)((long)&key.field_2 + 8));
  std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) != 0) {
    std::__cxx11::string::string((string *)local_2d0);
    std::__cxx11::stringstream::stringstream((stringstream *)(litTabPath.field_2._M_local_buf + 8));
    psVar4 = (streambuf *)std::ifstream::rdbuf();
    std::ostream::operator<<(local_450,psVar4);
    std::ifstream::close();
    std::operator>>((istream *)(litTabPath.field_2._M_local_buf + 8),(string *)local_2d0);
    std::operator>>((istream *)(litTabPath.field_2._M_local_buf + 8),(string *)local_2d0);
    while (bVar3 = std::ios::operator_cast_to_bool
                             ((ios *)((long)&litTabPath.field_2 +
                                     *(long *)(litTabPath.field_2._8_8_ + -0x18) + 8)), bVar3) {
      std::operator>>((istream *)(litTabPath.field_2._M_local_buf + 8),(string *)local_2d0);
      bVar2 = std::ios::operator!((ios *)((long)&litTabPath.field_2 +
                                         *(long *)(litTabPath.field_2._8_8_ + -0x18) + 8));
      if ((bVar2 & 1) != 0) break;
      pvVar5 = (void *)std::istream::operator>>((void *)((long)&litTabPath.field_2 + 8),std::hex);
      std::istream::operator>>(pvVar5,&local_2d4);
      bVar2 = std::ios::operator!((ios *)((long)&litTabPath.field_2 +
                                         *(long *)(litTabPath.field_2._8_8_ + -0x18) + 8));
      mVar1 = local_2d4;
      if ((bVar2 & 1) != 0) break;
      pmVar6 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&this->symTab,(key_type *)local_2d0);
      *pmVar6 = mVar1;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)(litTabPath.field_2._M_local_buf + 8))
    ;
    std::__cxx11::string::~string((string *)local_2d0);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480,
                 &this->srcFileName,".littab");
  std::ifstream::open((string *)&local_238,(_Ios_Openmode)local_480);
  bVar2 = std::ios::operator!((ios *)((long)&local_238 + *(long *)(local_238 + -0x18)));
  if ((bVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&key_1.field_2 + 8),"Reading LITTAB from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480);
    logDebug((string *)((long)&key_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(key_1.field_2._M_local_buf + 8));
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) != 0) {
      std::__cxx11::string::string((string *)local_4e8);
      std::__cxx11::stringstream::stringstream((stringstream *)&local_678);
      psVar4 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_668,psVar4);
      std::ifstream::close();
      std::operator>>((istream *)&local_678,(string *)local_4e8);
      std::operator>>((istream *)&local_678,(string *)local_4e8);
      while (bVar3 = std::ios::operator_cast_to_bool
                               ((ios *)((long)&local_678 + *(long *)(local_678 + -0x18))), bVar3) {
        std::operator>>((istream *)&local_678,(string *)local_4e8);
        bVar2 = std::ios::operator!((ios *)((long)&local_678 + *(long *)(local_678 + -0x18)));
        if ((bVar2 & 1) != 0) break;
        pvVar5 = (void *)std::istream::operator>>(&local_678,std::hex);
        std::istream::operator>>(pvVar5,&local_4ec);
        bVar2 = std::ios::operator!((ios *)((long)&local_678 + *(long *)(local_678 + -0x18)));
        mVar1 = local_4ec;
        if ((bVar2 & 1) != 0) break;
        pmVar6 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&this->litTab,(key_type *)local_4e8);
        *pmVar6 = mVar1;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_678);
      std::__cxx11::string::~string((string *)local_4e8);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4a0,"No LITTAB present",&local_4a1);
    logDebug(&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  }
  std::__cxx11::string::~string((string *)local_480);
  std::ifstream::~ifstream(&local_238);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void Pass2::readSymbols() {
        // reading from symTab
        std::string symTabPath = srcFileName + ".symtab";
        std::ifstream ifs(symTabPath);

        if (!ifs)
            throw std::runtime_error(std::string("Cannot open file: ") + symTabPath);

        logDebug("Reading SYMTAB from " + symTabPath);

        if (ifs.is_open()) {

            std::string key;
            int address;
            std::stringstream buf;

            buf << ifs.rdbuf();

            ifs.close();

            // ignoring SYMBOL & ADDRESS
            buf >> key;
            buf >> key;

            while (buf)
            {
                buf >> key;
                if (!buf)
                    break;
                //std::cout << key << "\t";

                buf >> std::hex >> address;
                if (!buf)
                    break;
                //std::cout << std::hex << address << std::endl;

                symTab[key] = address;
            }
        }

        //reading from litTab
        std::string litTabPath = srcFileName + ".littab";

        ifs.open(litTabPath);

        if (!ifs){
            logDebug("No LITTAB present");
            return;
        }

        logDebug("Reading LITTAB from " + litTabPath);

        if (ifs.is_open()) {

            std::string key;
            int address;
            std::stringstream buf;

            buf << ifs.rdbuf();
            ifs.close();

            // ignoring SYMBOL & ADDRESS
            buf >> key;
            buf >> key;

            while (buf)
            {
                buf >> key;
                if (!buf)
                    break;
                //std::cout << key << "\t";

                buf >> std::hex >> address;
                if (!buf)
                    break;
                //std::cout << std::hex << address << std::endl;

                litTab[key] = address;
            }
        }

    }